

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

int parse_png_file(png *z,int scan,int req_comp)

{
  uint8 **ppuVar1;
  uint uVar2;
  FILE *__stream;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  uint32 uVar7;
  uint32 uVar8;
  uint uVar9;
  int iVar10;
  size_t __size;
  size_t sVar11;
  uint8 *puVar12;
  long lVar13;
  ulong uVar14;
  uint8 *puVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  uint8 *puVar24;
  byte *pbVar25;
  uint8 *puVar26;
  byte bVar27;
  int i;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  uint8 tc [3];
  uint8 *local_4b0;
  uint32 raw_len;
  long local_450;
  long local_448;
  ulong local_440;
  uint8 palette [1024];
  
  lVar29 = 0;
  while (lVar29 != 8) {
    uVar6 = get8(&z->s);
    pbVar25 = &check_png_header_png_sig + lVar29;
    lVar29 = lVar29 + 1;
    if (uVar6 != *pbVar25) {
      failure_reason = "Not a PNG";
      return 0;
    }
  }
  if (scan == 1) {
    return 1;
  }
  bVar3 = true;
  uVar28 = 0;
  uVar20 = 0;
  uVar6 = 0;
  bVar4 = false;
  bVar27 = 0;
  do {
    uVar7 = get32(&z->s);
    uVar31 = (ulong)uVar7;
    uVar8 = get32(&z->s);
    if ((bool)(uVar8 != 0x49484452 & bVar3)) {
LAB_001c2648:
      failure_reason = "Corrupt PNG";
      return 0;
    }
    if (uVar8 == 0x49444154) {
      if ((bVar27 != 0) && (uVar28 == 0)) goto LAB_001c2648;
      uVar9 = uVar7 + uVar6;
      if (uVar20 < uVar9) {
        sVar11 = 0x1000;
        if (0x1000 < uVar7) {
          sVar11 = uVar31;
        }
        if (uVar20 != 0) {
          sVar11 = (ulong)uVar20;
        }
        do {
          __size = sVar11;
          uVar20 = (uint)__size;
          sVar11 = (ulong)(uVar20 * 2);
        } while (uVar20 < uVar9);
        puVar12 = (uint8 *)realloc(z->idata,__size);
        if (puVar12 == (uint8 *)0x0) goto LAB_001c279c;
        z->idata = puVar12;
      }
      __stream = (FILE *)(z->s).img_file;
      if (__stream == (FILE *)0x0) {
        memcpy(z->idata + uVar6,(z->s).img_buffer,uVar31);
        ppuVar1 = &(z->s).img_buffer;
        *ppuVar1 = *ppuVar1 + uVar31;
        uVar6 = uVar9;
      }
      else {
        sVar11 = fread(z->idata + uVar6,1,uVar31,__stream);
        uVar6 = uVar9;
        if (sVar11 != uVar31) goto LAB_001c2648;
      }
    }
    else if (uVar8 == 0x49484452) {
      if ((!bVar3) || (uVar7 != 0xd)) goto LAB_001c2648;
      uVar7 = get32(&z->s);
      (z->s).img_x = uVar7;
      if (0x1000000 < uVar7) {
LAB_001c1fbe:
        failure_reason = "Very large image (corrupt?)";
        return 0;
      }
      uVar7 = get32(&z->s);
      (z->s).img_y = uVar7;
      if (0x1000000 < uVar7) goto LAB_001c1fbe;
      iVar10 = get8(&z->s);
      if (iVar10 != 8) {
        failure_reason = "PNG not supported: 8-bit only";
        return 0;
      }
      uVar9 = get8(&z->s);
      if (((6 < (int)uVar9) ||
          (((bVar5 = 3, uVar9 != 3 && (bVar5 = bVar27, (uVar9 & 1) != 0)) ||
           (iVar10 = get8(&z->s), iVar10 != 0)))) || (iVar10 = get8(&z->s), iVar10 != 0))
      goto LAB_001c2648;
      iVar10 = get8(&z->s);
      if (iVar10 != 0) {
        failure_reason = "PNG not supported: interlaced mode";
        return 0;
      }
      uVar16 = (z->s).img_x;
      if ((uVar16 == 0) || (uVar2 = (z->s).img_y, uVar2 == 0)) goto LAB_001c2648;
      if (bVar5 == 0) {
        uVar9 = (uVar9 >> 2 & 1) + (uVar9 & 2) + 1;
        (z->s).img_n = uVar9;
        bVar27 = 0;
        if ((uint)((0x40000000 / (ulong)uVar16) / (ulong)uVar9) < uVar2) {
          failure_reason = "Image too large to decode";
          return 0;
        }
      }
      else {
        (z->s).img_n = 1;
        bVar27 = bVar5;
        if ((uint)(0x40000000 / (ulong)uVar16 >> 2) < uVar2) goto LAB_001c2648;
      }
    }
    else if (uVar8 == 0x504c5445) {
      if ((0x300 < uVar7) || (uVar28 = (uint)(ushort)((ushort)uVar7 / 3), uVar28 * 3 != uVar7))
      goto LAB_001c2648;
      for (uVar31 = 0; uVar28 != uVar31; uVar31 = uVar31 + 1) {
        iVar10 = get8(&z->s);
        palette[uVar31 * 4] = (uint8)iVar10;
        iVar10 = get8(&z->s);
        palette[uVar31 * 4 + 1] = (uint8)iVar10;
        iVar10 = get8(&z->s);
        palette[uVar31 * 4 + 2] = (uint8)iVar10;
        palette[uVar31 * 4 + 3] = 0xff;
      }
    }
    else if (uVar8 == 0x74524e53) {
      if (z->idata != (uint8 *)0x0) goto LAB_001c2648;
      if (bVar27 == 0) {
        uVar9 = (z->s).img_n;
        if (((uVar9 & 1) == 0) || (uVar9 * 2 != uVar7)) goto LAB_001c2648;
        for (lVar29 = 0; lVar29 < (int)uVar9; lVar29 = lVar29 + 1) {
          iVar10 = get16(&z->s);
          tc[lVar29] = (uint8)iVar10;
          uVar9 = (z->s).img_n;
        }
        bVar4 = true;
        bVar27 = 0;
      }
      else {
        if ((uVar28 == 0) || (uVar28 < uVar7)) goto LAB_001c2648;
        for (uVar23 = 0; uVar31 << 2 != uVar23; uVar23 = uVar23 + 4) {
          iVar10 = get8(&z->s);
          palette[(uVar23 & 0xffffffff) + 3] = (uint8)iVar10;
        }
        bVar27 = 4;
      }
    }
    else {
      if (uVar8 == 0x49454e44) {
        if (scan != 0) {
          return 1;
        }
        if (z->idata != (uint8 *)0x0) {
          puVar12 = (uint8 *)stbi_zlib_decode_malloc((char *)z->idata,uVar6,(int *)&raw_len);
          z->expanded = puVar12;
          if (puVar12 == (uint8 *)0x0) {
            return 0;
          }
          free(z->idata);
          z->idata = (uint8 *)0x0;
          uVar6 = (z->s).img_n;
          lVar29 = (long)(int)uVar6;
          uVar28 = uVar6 + 1;
          uVar20 = uVar28;
          if (!bVar4 && ((bVar27 != 0 || req_comp == 3) || uVar28 != req_comp)) {
            uVar20 = uVar6;
          }
          (z->s).img_out_n = uVar20;
          pbVar25 = z->expanded;
          uVar7 = (z->s).img_x;
          uVar9 = (z->s).img_y;
          uVar16 = uVar7 * uVar20;
          puVar12 = (uint8 *)malloc((ulong)(uVar9 * uVar16));
          z->out = puVar12;
          if (puVar12 == (uint8 *)0x0) {
            failure_reason = "Out of memory";
            return 0;
          }
          if ((uVar7 * uVar6 + 1) * uVar9 != raw_len) {
            failure_reason = "Corrupt PNG";
            return 0;
          }
          lVar13 = -(ulong)uVar16;
          lVar22 = (long)(int)uVar20;
          uVar20 = 0;
          uVar31 = 0;
          if (0 < (int)uVar6) {
            uVar31 = (ulong)uVar6;
          }
          lVar19 = lVar22 - lVar29;
          local_450 = lVar19 - (ulong)uVar16;
          for (uVar23 = 0; uVar23 < uVar9; uVar23 = uVar23 + 1) {
            uVar18 = (ulong)*pbVar25;
            if (4 < uVar18) {
              failure_reason = "Corrupt PNG";
              return 0;
            }
            if (uVar23 == 0) {
              uVar18 = (ulong)""[uVar18];
            }
            puVar15 = z->out;
            uVar6 = uVar16 * (int)uVar23;
            puVar12 = puVar15 + uVar20;
            lVar17 = (long)puVar12 + lVar13;
            uVar30 = 0;
            local_448 = lVar17;
            local_440 = uVar18;
            while( true ) {
              uVar14 = uVar18 & 0xff;
              if (uVar31 == uVar30) break;
              switch(uVar14) {
              case 0:
              case 1:
              case 5:
              case 6:
                bVar5 = pbVar25[uVar30 + 1];
                break;
              case 2:
                bVar5 = *(byte *)(lVar17 + uVar30);
                goto LAB_001c21de;
              case 3:
                bVar5 = *(byte *)(lVar17 + uVar30) >> 1;
LAB_001c21de:
                bVar5 = bVar5 + pbVar25[uVar30 + 1];
                break;
              case 4:
                bVar5 = pbVar25[uVar30 + 1];
                iVar10 = paeth(0,(uint)*(byte *)(lVar17 + uVar30),0);
                bVar5 = (char)iVar10 + bVar5;
                lVar17 = local_448;
                uVar18 = local_440;
                break;
              default:
                goto switchD_001c2187_default;
              }
              puVar12[uVar30] = bVar5;
switchD_001c2187_default:
              uVar30 = uVar30 + 1;
            }
            if (!bVar4 && ((bVar27 != 0 || req_comp == 3) || uVar28 != req_comp)) {
              pbVar25 = pbVar25 + lVar29 + 1;
              if ((byte)uVar18 < 7) {
                puVar24 = puVar15 + lVar22 + (ulong)uVar6;
                puVar12 = puVar15 + lVar22 + lVar13 + (ulong)uVar6;
                switch(uVar14) {
                case 0:
                  uVar7 = (z->s).img_x;
                  while (uVar7 = uVar7 - 1, uVar7 != 0) {
                    for (uVar18 = 0; uVar31 != uVar18; uVar18 = uVar18 + 1) {
                      puVar24[uVar18] = pbVar25[uVar18];
                    }
                    pbVar25 = pbVar25 + lVar29;
                    puVar24 = puVar24 + lVar29;
                  }
                  break;
                case 1:
                  uVar7 = (z->s).img_x;
                  puVar15 = puVar15 + (ulong)uVar20 + lVar19;
                  while (uVar7 = uVar7 - 1, uVar7 != 0) {
                    for (uVar18 = 0; uVar31 != uVar18; uVar18 = uVar18 + 1) {
                      puVar24[uVar18] = puVar15[uVar18] + pbVar25[uVar18];
                    }
                    pbVar25 = pbVar25 + lVar29;
                    puVar24 = puVar24 + lVar29;
                    puVar15 = puVar15 + lVar29;
                  }
                  break;
                case 2:
                  uVar7 = (z->s).img_x;
                  while (uVar7 = uVar7 - 1, uVar7 != 0) {
                    for (uVar18 = 0; uVar31 != uVar18; uVar18 = uVar18 + 1) {
                      puVar24[uVar18] = puVar12[uVar18] + pbVar25[uVar18];
                    }
                    pbVar25 = pbVar25 + lVar29;
                    puVar24 = puVar24 + lVar29;
                    puVar12 = puVar12 + lVar29;
                  }
                  break;
                case 3:
                  uVar7 = (z->s).img_x;
                  puVar15 = puVar15 + (ulong)uVar20 + lVar19;
                  while (uVar7 = uVar7 - 1, uVar7 != 0) {
                    for (uVar18 = 0; uVar31 != uVar18; uVar18 = uVar18 + 1) {
                      puVar24[uVar18] =
                           (char)((uint)puVar15[uVar18] + (uint)puVar12[uVar18] >> 1) +
                           pbVar25[uVar18];
                    }
                    pbVar25 = pbVar25 + lVar29;
                    puVar24 = puVar24 + lVar29;
                    puVar12 = puVar12 + lVar29;
                    puVar15 = puVar15 + lVar29;
                  }
                  break;
                case 4:
                  uVar7 = (z->s).img_x;
                  local_4b0 = puVar15 + (ulong)uVar20 + local_450;
                  puVar15 = puVar15 + (ulong)uVar20 + lVar19;
                  while (uVar7 = uVar7 - 1, uVar7 != 0) {
                    for (uVar18 = 0; uVar31 != uVar18; uVar18 = uVar18 + 1) {
                      bVar5 = pbVar25[uVar18];
                      iVar10 = paeth((uint)puVar15[uVar18],(uint)puVar12[uVar18],
                                     (uint)local_4b0[uVar18]);
                      puVar24[uVar18] = (char)iVar10 + bVar5;
                    }
                    pbVar25 = pbVar25 + lVar29;
                    puVar24 = puVar24 + lVar29;
                    puVar12 = puVar12 + lVar29;
                    local_4b0 = local_4b0 + lVar29;
                    puVar15 = puVar15 + lVar29;
                  }
                  break;
                case 5:
                  uVar7 = (z->s).img_x;
                  puVar15 = puVar15 + (ulong)uVar20 + lVar19;
                  while (uVar7 = uVar7 - 1, uVar7 != 0) {
                    for (uVar18 = 0; uVar31 != uVar18; uVar18 = uVar18 + 1) {
                      puVar24[uVar18] = (puVar15[uVar18] >> 1) + pbVar25[uVar18];
                    }
                    pbVar25 = pbVar25 + lVar29;
                    puVar24 = puVar24 + lVar29;
                    puVar15 = puVar15 + lVar29;
                  }
                  break;
                case 6:
                  uVar7 = (z->s).img_x;
                  puVar15 = puVar15 + (ulong)uVar20 + lVar19;
                  while (uVar7 = uVar7 - 1, uVar7 != 0) {
                    for (uVar18 = 0; uVar31 != uVar18; uVar18 = uVar18 + 1) {
                      puVar24[uVar18] = puVar15[uVar18] + pbVar25[uVar18];
                    }
                    pbVar25 = pbVar25 + lVar29;
                    puVar24 = puVar24 + lVar29;
                    puVar15 = puVar15 + lVar29;
                  }
                }
              }
            }
            else {
              puVar15[lVar29 + (ulong)uVar6] = 0xff;
              pbVar25 = pbVar25 + lVar29 + 1;
              if ((byte)uVar18 < 7) {
                puVar26 = puVar15 + lVar22 + (ulong)uVar6;
                puVar24 = puVar15 + lVar22 + lVar13 + (ulong)uVar6;
                switch(uVar14) {
                case 0:
                  uVar7 = (z->s).img_x;
                  while (uVar7 = uVar7 - 1, uVar7 != 0) {
                    for (uVar18 = 0; uVar31 != uVar18; uVar18 = uVar18 + 1) {
                      puVar26[uVar18] = pbVar25[uVar18];
                    }
                    puVar26[lVar29] = 0xff;
                    pbVar25 = pbVar25 + lVar29;
                    puVar26 = puVar26 + lVar22;
                  }
                  break;
                case 1:
                  uVar7 = (z->s).img_x;
                  puVar15 = puVar15 + uVar20;
                  while (uVar7 = uVar7 - 1, uVar7 != 0) {
                    for (uVar18 = 0; uVar31 != uVar18; uVar18 = uVar18 + 1) {
                      puVar26[uVar18] = puVar15[uVar18] + pbVar25[uVar18];
                    }
                    puVar26[lVar29] = 0xff;
                    pbVar25 = pbVar25 + lVar29;
                    puVar26 = puVar26 + lVar22;
                    puVar15 = puVar15 + lVar22;
                  }
                  break;
                case 2:
                  uVar7 = (z->s).img_x;
                  while (uVar7 = uVar7 - 1, uVar7 != 0) {
                    for (uVar18 = 0; uVar31 != uVar18; uVar18 = uVar18 + 1) {
                      puVar26[uVar18] = puVar26[uVar18 + lVar13] + pbVar25[uVar18];
                    }
                    puVar26[lVar29] = 0xff;
                    pbVar25 = pbVar25 + lVar29;
                    puVar26 = puVar26 + lVar22;
                  }
                  break;
                case 3:
                  uVar7 = (z->s).img_x;
                  while (uVar7 = uVar7 - 1, uVar7 != 0) {
                    for (uVar18 = 0; uVar18 != uVar31; uVar18 = uVar18 + 1) {
                      puVar26[uVar18] =
                           (char)((uint)puVar26[uVar18 - lVar22] + (uint)puVar24[uVar18] >> 1) +
                           pbVar25[uVar18];
                    }
                    puVar26[lVar29] = 0xff;
                    pbVar25 = pbVar25 + lVar29;
                    puVar26 = puVar26 + lVar22;
                    puVar24 = puVar24 + lVar22;
                  }
                  break;
                case 4:
                  uVar7 = (z->s).img_x;
                  puVar15 = puVar15 + uVar20;
                  local_4b0 = (uint8 *)(lVar13 + (long)puVar15);
                  while (uVar7 = uVar7 - 1, uVar7 != 0) {
                    for (uVar18 = 0; uVar31 != uVar18; uVar18 = uVar18 + 1) {
                      bVar5 = pbVar25[uVar18];
                      iVar10 = paeth((uint)puVar15[uVar18],(uint)puVar24[uVar18],
                                     (uint)*(byte *)((long)local_4b0 + uVar18));
                      puVar26[uVar18] = (char)iVar10 + bVar5;
                    }
                    puVar26[lVar29] = 0xff;
                    pbVar25 = pbVar25 + lVar29;
                    puVar26 = puVar26 + lVar22;
                    puVar24 = puVar24 + lVar22;
                    local_4b0 = (uint8 *)((long)local_4b0 + lVar22);
                    puVar15 = puVar15 + lVar22;
                  }
                  break;
                case 5:
                  uVar7 = (z->s).img_x;
                  puVar15 = puVar15 + uVar20;
                  while (uVar7 = uVar7 - 1, uVar7 != 0) {
                    for (uVar18 = 0; uVar31 != uVar18; uVar18 = uVar18 + 1) {
                      puVar26[uVar18] = (puVar15[uVar18] >> 1) + pbVar25[uVar18];
                    }
                    puVar26[lVar29] = 0xff;
                    pbVar25 = pbVar25 + lVar29;
                    puVar26 = puVar26 + lVar22;
                    puVar15 = puVar15 + lVar22;
                  }
                  break;
                case 6:
                  uVar7 = (z->s).img_x;
                  while (uVar7 = uVar7 - 1, uVar7 != 0) {
                    for (uVar18 = 0; uVar31 != uVar18; uVar18 = uVar18 + 1) {
                      puVar26[uVar18] = puVar12[uVar18] + pbVar25[uVar18];
                    }
                    puVar26[lVar29] = 0xff;
                    pbVar25 = pbVar25 + lVar29;
                    puVar26 = puVar26 + lVar22;
                    puVar12 = puVar12 + lVar22;
                  }
                }
              }
            }
            uVar9 = (z->s).img_y;
            uVar20 = uVar16 + uVar20;
          }
          if (bVar4) {
            iVar10 = (z->s).img_out_n;
            iVar21 = uVar9 * (z->s).img_x;
            puVar12 = z->out;
            if (iVar10 == 4) {
              for (lVar29 = 0; iVar21 != (int)lVar29; lVar29 = lVar29 + 1) {
                if (((puVar12[lVar29 * 4] == tc[0]) && (puVar12[lVar29 * 4 + 1] == tc[1])) &&
                   (puVar12[lVar29 * 4 + 2] == tc[2])) {
                  puVar12[lVar29 * 4 + 3] = '\0';
                }
              }
            }
            else {
              if (iVar10 != 2) {
                __assert_fail("out_n == 2 || out_n == 4",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/meruiden[P]CS3D/external/soil/src/stb_image_aug.c"
                              ,0x86d,"int compute_transparency(png *, uint8 *, int)");
              }
              for (lVar29 = 0; iVar21 != (int)lVar29; lVar29 = lVar29 + 1) {
                puVar12[lVar29 * 2 + 1] = -(puVar12[lVar29 * 2] != tc[0]);
              }
            }
          }
          if (bVar27 != 0) {
            (z->s).img_n = (uint)bVar27;
            uVar6 = (uint)bVar27;
            if (2 < req_comp) {
              uVar6 = req_comp;
            }
            (z->s).img_out_n = uVar6;
            uVar20 = (z->s).img_y * (z->s).img_x;
            puVar12 = z->out;
            puVar15 = (uint8 *)malloc((ulong)(uVar20 * uVar6));
            if (puVar15 == (uint8 *)0x0) {
LAB_001c279c:
              failure_reason = "Out of memory";
              return 0;
            }
            uVar31 = 0;
            puVar24 = puVar15;
            if (uVar6 == 3) {
              for (; uVar20 != uVar31; uVar31 = uVar31 + 1) {
                uVar23 = (ulong)puVar12[uVar31];
                *puVar24 = palette[uVar23 * 4];
                puVar24[1] = palette[uVar23 * 4 + 1];
                puVar24[2] = palette[uVar23 * 4 + 2];
                puVar24 = puVar24 + 3;
              }
            }
            else {
              for (; uVar20 != uVar31; uVar31 = uVar31 + 1) {
                *(undefined4 *)(puVar15 + uVar31 * 4) =
                     *(undefined4 *)(palette + (ulong)puVar12[uVar31] * 4);
              }
            }
            free(puVar12);
            z->out = puVar15;
          }
          free(z->expanded);
          z->expanded = (uint8 *)0x0;
          return 1;
        }
        goto LAB_001c2648;
      }
      if ((uVar8 >> 0x1d & 1) == 0) {
        failure_reason = "PNG not supported: unknown chunk type";
        return 0;
      }
      skip(&z->s,uVar7);
    }
    get32(&z->s);
    bVar3 = false;
  } while( true );
}

Assistant:

static int parse_png_file(png *z, int scan, int req_comp)
{
   uint8 palette[1024], pal_img_n=0;
   uint8 has_trans=0, tc[3];
   uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k;
   stbi *s = &z->s;

   if (!check_png_header(s)) return 0;

   if (scan == SCAN_type) return 1;

   for(;;first=0) {
      chunk c = get_chunk_header(s);
      if (first && c.type != PNG_TYPE('I','H','D','R'))
         return e("first not IHDR","Corrupt PNG");
      switch (c.type) {
         case PNG_TYPE('I','H','D','R'): {
            int depth,color,interlace,comp,filter;
            if (!first) return e("multiple IHDR","Corrupt PNG");
            if (c.length != 13) return e("bad IHDR len","Corrupt PNG");
            s->img_x = get32(s); if (s->img_x > (1 << 24)) return e("too large","Very large image (corrupt?)");
            s->img_y = get32(s); if (s->img_y > (1 << 24)) return e("too large","Very large image (corrupt?)");
            depth = get8(s);  if (depth != 8)        return e("8bit only","PNG not supported: 8-bit only");
            color = get8(s);  if (color > 6)         return e("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return e("bad ctype","Corrupt PNG");
            comp  = get8(s);  if (comp) return e("bad comp method","Corrupt PNG");
            filter= get8(s);  if (filter) return e("bad filter method","Corrupt PNG");
            interlace = get8(s); if (interlace) return e("interlaced","PNG not supported: interlaced mode");
            if (!s->img_x || !s->img_y) return e("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return e("too large", "Image too large to decode");
               if (scan == SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return e("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case PNG_TYPE('P','L','T','E'):  {
            if (c.length > 256*3) return e("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return e("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = get8u(s);
               palette[i*4+1] = get8u(s);
               palette[i*4+2] = get8u(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case PNG_TYPE('t','R','N','S'): {
            if (z->idata) return e("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return e("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return e("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = get8u(s);
            } else {
               if (!(s->img_n & 1)) return e("tRNS with alpha","Corrupt PNG");
               if (c.length != (uint32) s->img_n*2) return e("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               for (k=0; k < s->img_n; ++k)
                  tc[k] = (uint8) get16(s); // non 8-bit images will be larger
            }
            break;
         }

         case PNG_TYPE('I','D','A','T'): {
            if (pal_img_n && !pal_len) return e("no PLTE","Corrupt PNG");
            if (scan == SCAN_header) { s->img_n = pal_img_n; return 1; }
            if (ioff + c.length > idata_limit) {
               uint8 *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               p = (uint8 *) realloc(z->idata, idata_limit); if (p == NULL) return e("outofmem", "Out of memory");
               z->idata = p;
            }
            #ifndef STBI_NO_STDIO
            if (s->img_file)
            {
               if (fread(z->idata+ioff,1,c.length,s->img_file) != c.length) return e("outofdata","Corrupt PNG");
            }
            else
            #endif
            {
               memcpy(z->idata+ioff, s->img_buffer, c.length);
               s->img_buffer += c.length;
            }
            ioff += c.length;
            break;
         }

         case PNG_TYPE('I','E','N','D'): {
            uint32 raw_len;
            if (scan != SCAN_load) return 1;
            if (z->idata == NULL) return e("no IDAT","Corrupt PNG");
            z->expanded = (uint8 *) stbi_zlib_decode_malloc((char *) z->idata, ioff, (int *) &raw_len);
            if (z->expanded == NULL) return 0; // zlib should set error
            free(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!create_png_image(z, z->expanded, raw_len, s->img_out_n)) return 0;
            if (has_trans)
               if (!compute_transparency(z, tc, s->img_out_n)) return 0;
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!expand_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            }
            free(z->expanded); z->expanded = NULL;
            return 1;
         }

         default:
            // if critical, fail
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX chunk not known";
               invalid_chunk[0] = (uint8) (c.type >> 24);
               invalid_chunk[1] = (uint8) (c.type >> 16);
               invalid_chunk[2] = (uint8) (c.type >>  8);
               invalid_chunk[3] = (uint8) (c.type >>  0);
               #endif
               return e(invalid_chunk, "PNG not supported: unknown chunk type");
            }
            skip(s, c.length);
            break;
      }
      // end of chunk, read and skip CRC
      get32(s);
   }
}